

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O3

void __thiscall
JsrtDebugManager::ReportExceptionBreak(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  Utf8SourceInfo *utf8SourceInfo;
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  int byteCodeOffset;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  DynamicObject *object;
  undefined1 local_50 [8];
  JsrtDebugEventObject debugEventObject;
  
  if (this->debugEventCallback == (JsDiagDebugEventCallback)0x0) {
    return;
  }
  debugEventObject.scriptContext = (ScriptContext *)this;
  if (haltState->stopType != STOP_EXCEPTIONTHROW) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x12d,"(haltState->stopType == Js::STOP_EXCEPTIONTHROW)",
                       "haltState->stopType == Js::STOP_EXCEPTIONTHROW");
    if (!bVar2) goto LAB_003a2e8d;
    *puVar3 = 0;
  }
  pFVar4 = Js::InterpreterHaltState::GetFunction(haltState);
  utf8SourceInfo = (pFVar4->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  scriptContext = (utf8SourceInfo->m_scriptContext).ptr;
  JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)local_50,scriptContext);
  object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)local_50);
  JsrtDebugUtils::AddScriptIdToObject(object,utf8SourceInfo);
  pFVar4 = Js::DiagStackFrame::GetFunction(haltState->topFrame);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x13c,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar2) {
LAB_003a2e8d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  byteCodeOffset = (*haltState->topFrame->_vptr_DiagStackFrame[3])();
  JsrtDebugUtils::AddLineColumnToObject(object,pFVar4,byteCodeOffset);
  JsrtDebugUtils::AddSourceLengthAndTextToObject(object,pFVar4,byteCodeOffset);
  JsrtDebugUtils::AddPropertyToObject
            (object,(JsrtDebugPropertyId)0x22,(haltState->exceptionObject->field_0x14 & 0x10) == 0,
             scriptContext);
  Js::ScriptContext::GetDebugContext(scriptContext);
}

Assistant:

void JsrtDebugManager::ReportExceptionBreak(Js::InterpreterHaltState* haltState)
{
    if (this->debugEventCallback != nullptr)
    {
        Assert(haltState->stopType == Js::STOP_EXCEPTIONTHROW);

        Js::Utf8SourceInfo* utf8SourceInfo = haltState->GetFunction()->GetUtf8SourceInfo();
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsDiagDebugEvent jsDiagDebugEvent = JsDiagDebugEventRuntimeException;

        JsrtDebugEventObject debugEventObject(scriptContext);

        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        JsrtDebugUtils::AddScriptIdToObject(eventDataObject, utf8SourceInfo);

        Js::FunctionBody* functionBody = haltState->topFrame->GetFunction();

        Assert(functionBody != nullptr);
        
        int currentByteCodeOffset = haltState->topFrame->GetByteCodeOffset();
        JsrtDebugUtils::AddLineColumnToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddSourceLengthAndTextToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::uncaught, !haltState->exceptionObject->IsFirstChanceException(), scriptContext);

        Js::ResolvedObject resolvedObject;
        resolvedObject.scriptContext = scriptContext;
        resolvedObject.name = _u("{exception}");
        resolvedObject.typeId = Js::TypeIds_Error;
        resolvedObject.address = nullptr;
        resolvedObject.obj = scriptContext->GetDebugContext()->GetProbeContainer()->GetExceptionObject();

        if (resolvedObject.obj == nullptr)
        {
            resolvedObject.obj = resolvedObject.scriptContext->GetLibrary()->GetUndefined();
        }

        JsrtDebuggerObjectBase::CreateDebuggerObject<JsrtDebuggerObjectProperty>(this->GetDebuggerObjectsManager(), resolvedObject, scriptContext, /* forceSetValueProp */ false, [&](Js::Var marshaledObj)
        {
            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::exception, marshaledObj, scriptContext);
        });
        
        this->CallDebugEventCallbackForBreak(jsDiagDebugEvent, eventDataObject, scriptContext);
    }
}